

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpcompoundpacket.cpp
# Opt level: O0

void __thiscall
jrtplib::RTCPCompoundPacket::RTCPCompoundPacket
          (RTCPCompoundPacket *this,RTPRawPacket *rawpack,RTPMemoryManager *mgr)

{
  bool bVar1;
  int iVar2;
  uint8_t *puVar3;
  size_t sVar4;
  iterator local_50;
  _List_const_iterator<jrtplib::RTCPPacket_*> local_48;
  size_t local_40;
  size_t datalen;
  uint8_t *data;
  RTPMemoryManager *local_20;
  RTPMemoryManager *mgr_local;
  RTPRawPacket *rawpack_local;
  RTCPCompoundPacket *this_local;
  
  local_20 = mgr;
  mgr_local = (RTPMemoryManager *)rawpack;
  rawpack_local = (RTPRawPacket *)this;
  RTPMemoryObject::RTPMemoryObject(&this->super_RTPMemoryObject,mgr);
  (this->super_RTPMemoryObject)._vptr_RTPMemoryObject =
       (_func_int **)&PTR__RTCPCompoundPacket_00193778;
  std::__cxx11::list<jrtplib::RTCPPacket_*,_std::allocator<jrtplib::RTCPPacket_*>_>::list
            (&this->rtcppacklist);
  std::_List_const_iterator<jrtplib::RTCPPacket_*>::_List_const_iterator(&this->rtcppackit);
  this->compoundpacket = (uint8_t *)0x0;
  this->compoundpacketlength = 0;
  this->error = 0;
  bVar1 = RTPRawPacket::IsRTP((RTPRawPacket *)mgr_local);
  if (bVar1) {
    this->error = -0x1e;
  }
  else {
    datalen = (size_t)RTPRawPacket::GetData((RTPRawPacket *)mgr_local);
    local_40 = RTPRawPacket::GetDataLength((RTPRawPacket *)mgr_local);
    iVar2 = ParseData(this,(uint8_t *)datalen,local_40);
    this->error = iVar2;
    if (-1 < this->error) {
      puVar3 = RTPRawPacket::GetData((RTPRawPacket *)mgr_local);
      this->compoundpacket = puVar3;
      sVar4 = RTPRawPacket::GetDataLength((RTPRawPacket *)mgr_local);
      this->compoundpacketlength = sVar4;
      this->deletepacket = true;
      RTPRawPacket::ZeroData((RTPRawPacket *)mgr_local);
      local_50._M_node =
           (_List_node_base *)
           std::__cxx11::list<jrtplib::RTCPPacket_*,_std::allocator<jrtplib::RTCPPacket_*>_>::begin
                     (&this->rtcppacklist);
      std::_List_const_iterator<jrtplib::RTCPPacket_*>::_List_const_iterator(&local_48,&local_50);
      (this->rtcppackit)._M_node = local_48._M_node;
    }
  }
  return;
}

Assistant:

RTCPCompoundPacket::RTCPCompoundPacket(RTPRawPacket &rawpack, RTPMemoryManager *mgr) : RTPMemoryObject(mgr)
{
	compoundpacket = 0;
	compoundpacketlength = 0;
	error = 0;
	
	if (rawpack.IsRTP())
	{
		error = ERR_RTP_RTCPCOMPOUND_INVALIDPACKET;
		return;
	}

	uint8_t *data = rawpack.GetData();
	size_t datalen = rawpack.GetDataLength();

	error = ParseData(data,datalen);
	if (error < 0)
		return;
	
	compoundpacket = rawpack.GetData();
	compoundpacketlength = rawpack.GetDataLength();
	deletepacket = true;

	rawpack.ZeroData();
	
	rtcppackit = rtcppacklist.begin();
}